

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# property.cpp
# Opt level: O3

int __thiscall QMakeProperty::setProperty(QMakeProperty *this,QStringList *optionProperties)

{
  QString var;
  char cVar1;
  int iVar2;
  QString *pQVar3;
  QString *pQVar4;
  long lVar5;
  long in_FS_OFFSET;
  QByteArrayView QVar6;
  undefined8 in_stack_ffffffffffffff58;
  QArrayData *pQVar7;
  QArrayData *local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  QString local_70;
  QArrayData *local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar5 = (optionProperties->d).size;
  iVar2 = 0;
  if (lVar5 != 0) {
    pQVar3 = (optionProperties->d).ptr;
    pQVar4 = pQVar3;
    do {
      local_70.d.d = (pQVar4->d).d;
      local_70.d.ptr = (pQVar4->d).ptr;
      local_70.d.size = (pQVar4->d).size;
      if (&(local_70.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_70.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_70.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
        pQVar3 = (optionProperties->d).ptr;
        lVar5 = (optionProperties->d).size;
      }
      if (pQVar4 + 1 == pQVar3 + lVar5) {
        if (&(local_70.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_70.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_70.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_70.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_70.d.d)->super_QArrayData,2,0x10);
          }
        }
        iVar2 = 0x65;
        goto LAB_0010ebaf;
      }
      QVar6.m_data = (storage_type *)0x1;
      QVar6.m_size = (qsizetype)&local_58;
      QString::fromUtf8(QVar6);
      local_88 = local_58;
      uStack_80 = uStack_50;
      local_78 = local_48;
      cVar1 = QString::startsWith(&local_70,(CaseSensitivity)&local_88);
      if (local_88 != (QArrayData *)0x0) {
        LOCK();
        (local_88->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_88->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_88->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_88,2,0x10);
        }
      }
      if (cVar1 == '\0') {
        if (&(local_70.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_70.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_70.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
          UNLOCK();
        }
        var.d.ptr = (char16_t *)local_70.d.d;
        var.d.d = (Data *)in_stack_ffffffffffffff58;
        var.d.size = (qsizetype)local_70.d.ptr;
        pQVar7 = &(local_70.d.d)->super_QArrayData;
        setValue(this,var,(QString *)&stack0xffffffffffffff60);
        if (pQVar7 != (QArrayData *)0x0) {
          LOCK();
          (pQVar7->ref_)._q_value.super___atomic_base<int>._M_i =
               (pQVar7->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((pQVar7->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(pQVar7,2,0x10);
          }
        }
      }
      if (&(local_70.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_70.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_70.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_70.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_70.d.d)->super_QArrayData,2,0x10);
        }
      }
      pQVar4 = pQVar4 + 2;
      pQVar3 = (optionProperties->d).ptr;
      lVar5 = (optionProperties->d).size;
    } while (pQVar4 != pQVar3 + lVar5);
    iVar2 = 0;
  }
LAB_0010ebaf:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return iVar2;
  }
  __stack_chk_fail();
}

Assistant:

int QMakeProperty::setProperty(const QStringList &optionProperties)
{
    for (auto it = optionProperties.cbegin(); it != optionProperties.cend(); ++it) {
        QString var = (*it);
        ++it;
        if (it == optionProperties.cend()) {
            return PropFailRetCode;
        }
        if (!var.startsWith("."))
            setValue(var, (*it));
    }
    return PropSuccessRetCode;
}